

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O3

WeightConstraint *
Clasp::WeightConstraint::doCreate(Solver *s,Literal W,WeightLitsRep *rep,uint32 flags)

{
  uint uVar1;
  Share SVar2;
  Solver *s_00;
  bool bVar3;
  bool bVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  SharedContext *ctx;
  int iVar7;
  uint uVar8;
  uint uVar9;
  WL *out;
  WeightConstraint *pWVar10;
  uint uVar11;
  Result RVar12;
  LitVec clause;
  ulong local_78;
  uint local_70;
  uint local_6c;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> local_68;
  ClauseRep local_50;
  WeightLitsRep *local_40;
  Solver *local_38;
  
  local_70 = 3;
  if (((flags & 0xc0) != 0) && ((flags & 0xc0) != 0xc0)) {
    local_70 = flags >> 7 & 1;
  }
  uVar5 = rep->size;
  Solver::acquireProblemVar(s,W.rep_ >> 2);
  bVar3 = WeightLitsRep::propagate(rep,s,W);
  if (!bVar3) {
    return (WeightConstraint *)0x1;
  }
  iVar7 = rep->bound;
  if (rep->reach < iVar7) {
    return (WeightConstraint *)0x0;
  }
  if (iVar7 < 1 && ((byte)flags >> 2 & uVar5 != 0) == 0) {
    return (WeightConstraint *)0x0;
  }
  if ((iVar7 != 1 && iVar7 != rep->reach) || (local_70 != 3 || (flags & 1) != 0)) {
    SVar2 = s->shared_->share_;
    local_6c = 0x18;
    if (((uint)SVar2 >> 0x19 & 1) == 0) {
      local_6c = ~(uint)SVar2 >> 0x10 & 0x10;
    }
    local_6c = local_6c | flags;
    uVar5 = rep->size;
    if (uVar5 == 0) {
      bVar3 = false;
    }
    else {
      bVar3 = 1 < rep->lits->second;
    }
    uVar8 = (uint)bVar3;
    uVar11 = uVar5 + 1;
    iVar7 = (uVar5 + uVar8 + 1) * 4;
    uVar1 = (uVar11 << bVar3) * 4 + 4;
    local_40 = rep;
    local_38 = s;
    if ((local_6c & 0x10) == 0) {
      pWVar10 = (WeightConstraint *)operator_new((ulong)(iVar7 + 0x20));
      puVar6 = (undefined4 *)operator_new((ulong)uVar1 + 4);
      LOCK();
      *puVar6 = 1;
      UNLOCK();
      puVar6[1] = (uVar11 & 0x3fffffff) + uVar8 * -0x80000000 + 0x40000000;
      out = (WL *)(puVar6 + 1);
    }
    else {
      uVar9 = iVar7 + 0x20;
      pWVar10 = (WeightConstraint *)operator_new((ulong)(uVar9 + uVar1));
      out = (WL *)((long)pWVar10->bound_ + ((ulong)uVar9 - 0x14));
      *(uint *)((long)pWVar10->bound_ + ((ulong)uVar9 - 0x14)) = uVar8 << 0x1f | uVar11 & 0x3fffffff
      ;
    }
    s_00 = local_38;
    if ((local_6c & 8) == 0) {
      ctx = local_38->shared_;
    }
    else {
      ctx = (SharedContext *)0x0;
    }
    WeightConstraint(pWVar10,local_38,ctx,W,local_40,out,local_70);
    bVar3 = integrateRoot(pWVar10,s_00);
    if (bVar3) {
      if ((flags & 3) != 0) {
        return pWVar10;
      }
      Solver::add(s_00,&pWVar10->super_Constraint);
      return pWVar10;
    }
    (*(pWVar10->super_Constraint)._vptr_Constraint[5])(pWVar10,s_00,1);
    return (WeightConstraint *)0x1;
  }
  local_68.ebo_.buf = (pointer)0x0;
  local_68.ebo_.size = 0;
  local_68.ebo_.cap = 0;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::reserve
            (&local_68,rep->size + 1);
  local_78 = 0;
  uVar1 = (uint)(rep->bound == 1) * 2;
  local_50.info.super_ConstraintScore.rep =
       (ConstraintScore)(ConstraintScore)(W.rep_ & 0xfffffffe ^ uVar1);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
            (&local_68,(Literal *)&local_50);
  uVar5 = rep->size;
  if (uVar5 != 0) {
    bVar3 = false;
    uVar8 = 0;
    do {
      uVar11 = (local_68.ebo_.buf)->rep_;
      uVar9 = rep->lits[uVar8].first.rep_ & 0xfffffffe ^ uVar1;
      local_78 = CONCAT44(uVar9,uVar11) & 0xfffffffffffffffe ^ 2;
      if ((uVar11 ^ uVar9) < 2) {
        do {
          if (uVar5 - 1 == uVar8) goto LAB_001799d9;
          uVar8 = uVar8 + 1;
          uVar11 = (local_68.ebo_.buf)->rep_;
          uVar9 = rep->lits[uVar8].first.rep_ & 0xfffffffe ^ uVar1;
          local_78 = CONCAT44(uVar9,uVar11) & 0xfffffffffffffffe ^ 2;
        } while ((uVar11 ^ uVar9) < 2);
        bVar3 = true;
      }
      if (uVar9 != (uVar11 & 0xfffffffe ^ 2)) {
        local_50._0_8_ = CONCAT44(local_50._4_4_,uVar9) ^ 2;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (&local_68,(Literal *)&local_50);
      }
      local_50._0_8_ = 0x200000000;
      local_50.lits = (Literal *)&local_78;
      bVar4 = Solver::add(s,&local_50,true);
      if (!bVar4) {
        pWVar10 = (WeightConstraint *)0x1;
        goto LAB_00179b4d;
      }
      uVar5 = rep->size;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar5);
    if (bVar3) {
LAB_001799d9:
      pWVar10 = (WeightConstraint *)0x0;
      goto LAB_00179b4d;
    }
  }
  local_50._0_8_ = local_50._0_8_ & 0xffffffff00000000;
  RVar12 = ClauseCreator::create(s,&local_68,0,&local_50.info);
  pWVar10 = (WeightConstraint *)(ulong)((RVar12.status & status_unsat) >> 1);
LAB_00179b4d:
  if (local_68.ebo_.buf != (pointer)0x0) {
    operator_delete(local_68.ebo_.buf);
  }
  return pWVar10;
}

Assistant:

WeightConstraint* WeightConstraint::doCreate(Solver& s, Literal W, WeightLitsRep& rep, uint32 flags) {
	WeightConstraint* conflict = (WeightConstraint*)0x1;
	const uint32 onlyOne = create_only_btb|create_only_bfb;
	uint32 act  = 3u;
	if ((flags & onlyOne) && (flags & onlyOne) != onlyOne) {
		act = (flags & create_only_bfb) != 0u;
	}
	bool addSat = (flags&create_sat) != 0 && rep.size;
	s.acquireProblemVar(W.var());
	if (!rep.propagate(s, W))                 { return conflict; }
	if (rep.unsat() || (rep.sat() && !addSat)){ return 0; }
	if ((rep.bound == 1 || rep.bound == rep.reach) && (flags & create_explicit) == 0 && act == 3u) {
		LitVec clause; clause.reserve(1 + rep.size);
		Literal bin[2];
		bool disj = rep.bound == 1; // con == disjunction or con == conjunction
		bool sat  = false;
		clause.push_back(W ^ disj);
		for (LitVec::size_type i = 0; i != rep.size; ++i) {
			bin[0] = ~clause[0];
			bin[1] = rep.lits[i].first ^ disj;
			if (bin[0] != ~bin[1]) {
				if (bin[0] != bin[1])                 { clause.push_back(~bin[1]); }
				if (!s.add(ClauseRep::create(bin, 2))){ return conflict; }
			}
			else { sat = true; }
		}
		return (sat || ClauseCreator::create(s, clause, 0)) ? 0 : conflict;
	}
	assert(rep.open() || (rep.sat() && addSat));
	if (!s.sharedContext()->physicalShareProblem()) { flags |= create_no_share; }
	if (s.sharedContext()->frozen())                { flags |= (create_no_freeze|create_no_share); }
	bool   hasW = rep.hasWeights();
	uint32 size = 1 + rep.size;
	uint32 nb   = sizeof(WeightConstraint) + (size+uint32(hasW))*sizeof(UndoInfo);
	uint32 wls  = sizeof(WL) + (size << uint32(hasW))*sizeof(Literal);
	void*  m    = 0;
	WL*    sL   = 0;
	if ((flags & create_no_share) != 0) {
		nb = ((nb + 3) / 4)*4;
		m  = ::operator new (nb + wls);
		sL = new (reinterpret_cast<unsigned char*>(m)+nb) WL(size, false, hasW);
	}
	else {
		static_assert(sizeof(RCType) == sizeof(uint32), "Invalid size!");
		m = ::operator new(nb);
		uint8* t = (uint8*)::operator new(wls + sizeof(uint32));
		*(new (t) RCType) = 1;
		sL = new (t+sizeof(uint32)) WL(size, true, hasW);
	}
	assert(m && (reinterpret_cast<uintp>(m) & 7u) == 0);
	SharedContext*  ctx = (flags & create_no_freeze) == 0 ? const_cast<SharedContext*>(s.sharedContext()) : 0;
	WeightConstraint* c = new (m) WeightConstraint(s, ctx, W, rep, sL, act);
	if (!c->integrateRoot(s)) {
		c->destroy(&s, true);
		return conflict;
	}
	if ((flags & create_no_add) == 0) { s.add(c); }
	return c;
}